

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O3

bool __thiscall MipsElfFile::seekPhysical(MipsElfFile *this,int64_t physicalAddress)

{
  pointer ppEVar1;
  ElfSegment *pEVar2;
  pointer ppEVar3;
  ElfSection *pEVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *text;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  ppEVar1 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar6 = 0;
    do {
      pEVar2 = ppEVar1[lVar6];
      uVar7 = (ulong)(pEVar2->header).p_offset;
      if (((long)uVar7 <= physicalAddress) &&
         (physicalAddress < (long)((pEVar2->header).p_filesz + uVar7))) {
        lVar8 = *(long *)&(pEVar2->sections).
                          super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                          super__Vector_impl_data;
        lVar9 = (long)*(pointer *)
                       ((long)&(pEVar2->sections).
                               super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                               _M_impl + 8) - lVar8;
        if (lVar9 != 0) {
          lVar9 = lVar9 >> 3;
          lVar10 = 0;
          do {
            lVar5 = *(long *)(lVar8 + lVar10 * 8);
            lVar11 = *(uint *)(lVar5 + 0x10) + uVar7;
            if ((lVar11 <= physicalAddress) &&
               (physicalAddress < (long)(lVar11 + (ulong)*(uint *)(lVar5 + 0x14)))) {
              this->segment = (int)lVar6;
              this->section = (int)lVar10;
              this->sectionOffset = physicalAddress - lVar11;
              return true;
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
        }
        text = "Found segment, but no containing section";
        goto LAB_00180273;
      }
      lVar6 = lVar6 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
  }
  ppEVar3 = (this->elf).segmentlessSections.
            super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(this->elf).segmentlessSections.
                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar3;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar6 = 0;
    do {
      pEVar4 = ppEVar3[lVar6];
      uVar7 = (ulong)(pEVar4->header).sh_offset;
      if (((long)uVar7 <= physicalAddress) &&
         (physicalAddress < (long)((pEVar4->header).sh_size + uVar7))) {
        this->segment = -1;
        this->section = (int)lVar6;
        this->sectionOffset = physicalAddress - uVar7;
        return true;
      }
      lVar6 = lVar6 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
  }
  this->segment = -1;
  this->section = -1;
  text = "Couldn\'t find a section";
LAB_00180273:
  Logger::queueError<>(Error,text);
  return false;
}

Assistant:

bool MipsElfFile::seekPhysical(int64_t physicalAddress)
{
	// search in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int64_t segStart = seg->getOffset();
		int64_t segEnd = segStart+seg->getPhysSize();

		if (segStart <= physicalAddress && physicalAddress < segEnd)
		{
			// find section
			for (size_t l = 0; l < seg->getSectionCount(); l++)
			{
				ElfSection* sect = seg->getSection(l);
				int64_t sectStart = segStart+sect->getOffset();
				int64_t sectEnd = sectStart+sect->getSize();
				
				if (sectStart <= physicalAddress && physicalAddress < sectEnd)
				{
					segment = (int) i;
					section = (int) l;
					sectionOffset = physicalAddress-sectStart;
					return true;
				}
			}

			Logger::queueError(Logger::Error, "Found segment, but no containing section");
			return false;
		}
	}

	// search in segmentless sections
	for (size_t i = 0; i < elf.getSegmentlessSectionCount(); i++)
	{
		ElfSection* sect = elf.getSegmentlessSection(i);
		int64_t sectStart = sect->getOffset();
		int64_t sectEnd = sectStart+sect->getSize();
		
		if (sectStart <= physicalAddress && physicalAddress < sectEnd)
		{
			segment = -1;
			section = (int) i;
			sectionOffset = physicalAddress-sectStart;
			return true;
		}
	}

	segment = -1;
	section = -1;
	Logger::queueError(Logger::Error, "Couldn't find a section");
	return false;
}